

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

int DSA_set0_pqg(DSA *dsa,BIGNUM *p,BIGNUM *q,BIGNUM *g)

{
  BIGNUM *g_local;
  BIGNUM *q_local;
  BIGNUM *p_local;
  DSA *dsa_local;
  
  if ((((dsa->p == (BIGNUM *)0x0) && (p == (BIGNUM *)0x0)) ||
      ((dsa->q == (BIGNUM *)0x0 && (q == (BIGNUM *)0x0)))) ||
     ((dsa->g == (BIGNUM *)0x0 && (g == (BIGNUM *)0x0)))) {
    dsa_local._4_4_ = 0;
  }
  else {
    if (p != (BIGNUM *)0x0) {
      BN_free((BIGNUM *)dsa->p);
      dsa->p = p;
    }
    if (q != (BIGNUM *)0x0) {
      BN_free((BIGNUM *)dsa->q);
      dsa->q = q;
    }
    if (g != (BIGNUM *)0x0) {
      BN_free((BIGNUM *)dsa->g);
      dsa->g = g;
    }
    BN_MONT_CTX_free((BN_MONT_CTX *)dsa->method_mont_p);
    dsa->method_mont_p = (BN_MONT_CTX *)0x0;
    BN_MONT_CTX_free((BN_MONT_CTX *)dsa->method_mont_q);
    dsa->method_mont_q = (BN_MONT_CTX *)0x0;
    dsa_local._4_4_ = 1;
  }
  return dsa_local._4_4_;
}

Assistant:

int DSA_set0_pqg(DSA *dsa, BIGNUM *p, BIGNUM *q, BIGNUM *g) {
  if ((dsa->p == NULL && p == NULL) || (dsa->q == NULL && q == NULL) ||
      (dsa->g == NULL && g == NULL)) {
    return 0;
  }

  if (p != NULL) {
    BN_free(dsa->p);
    dsa->p = p;
  }
  if (q != NULL) {
    BN_free(dsa->q);
    dsa->q = q;
  }
  if (g != NULL) {
    BN_free(dsa->g);
    dsa->g = g;
  }

  BN_MONT_CTX_free(dsa->method_mont_p);
  dsa->method_mont_p = NULL;
  BN_MONT_CTX_free(dsa->method_mont_q);
  dsa->method_mont_q = NULL;
  return 1;
}